

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsEvaluation
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *constraintsValue)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  Index size;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ostream *poVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  ostringstream errorMsg;
  string local_1f0;
  long local_1d0;
  VectorDynSize *local_1c8;
  long local_1c0;
  _Rb_tree_node_base *local_1b8;
  double local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = time;
  uVar6 = iDynTree::VectorDynSize::size();
  uVar5 = getConstraintsDimension(this);
  if (uVar6 != uVar5) {
    getConstraintsDimension(this);
    iDynTree::VectorDynSize::resize((ulong)constraintsValue);
  }
  local_1c0 = iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  p_Var10 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1b8 = &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar14 = p_Var10 == local_1b8;
  if (!bVar14) {
    local_1d0 = 0;
    local_1c8 = state;
    do {
      bVar4 = ConstraintsGroup::evaluateConstraints
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var10 + 2),local_1b0,state,control,
                         (VectorDynSize *)(*(undefined8 **)(p_Var10 + 2) + 2));
      if (bVar4) {
        lVar7 = iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        uVar8 = iDynTree::VectorDynSize::size();
        state = local_1c8;
        uVar6 = local_1c0 + local_1d0 * 8;
        uVar11 = uVar8;
        if (((uVar6 & 7) == 0) &&
           (uVar11 = (ulong)((uint)(uVar6 >> 3) & 1), (long)uVar8 <= (long)uVar11)) {
          uVar11 = uVar8;
        }
        if (0 < (long)uVar11) {
          uVar12 = 0;
          do {
            *(undefined8 *)(uVar6 + uVar12 * 8) = *(undefined8 *)(lVar7 + uVar12 * 8);
            uVar12 = uVar12 + 1;
          } while (uVar11 != uVar12);
        }
        lVar13 = uVar8 - uVar11;
        uVar12 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
        if (1 < lVar13) {
          do {
            puVar1 = (undefined8 *)(lVar7 + uVar11 * 8);
            uVar3 = puVar1[1];
            puVar2 = (undefined8 *)(uVar6 + uVar11 * 8);
            *puVar2 = *puVar1;
            puVar2[1] = uVar3;
            uVar11 = uVar11 + 2;
          } while ((long)uVar11 < (long)uVar12);
        }
        if ((long)uVar12 < (long)uVar8) {
          do {
            *(undefined8 *)(uVar6 + uVar12 * 8) = *(undefined8 *)(lVar7 + uVar12 * 8);
            uVar12 = uVar12 + 1;
          } while (uVar8 != uVar12);
        }
        lVar7 = iDynTree::VectorDynSize::size();
        local_1d0 = local_1d0 + lVar7;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error while evaluating constraint ",0x22);
        ConstraintsGroup::name_abi_cxx11_
                  (&local_1f0,(ConstraintsGroup *)**(undefined8 **)(p_Var10 + 2));
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,
                            local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","constraintsEvaluation",local_1f0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if (!bVar4) {
        return bVar14;
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      bVar14 = p_Var10 == local_1b8;
    } while (!bVar14);
  }
  return bVar14;
}

Assistant:

bool OptimalControlProblem::constraintsEvaluation(double time, const VectorDynSize &state, const VectorDynSize &control, VectorDynSize &constraintsValue)
        {
            if (constraintsValue.size() != getConstraintsDimension()) {
                constraintsValue.resize(getConstraintsDimension());
            }

            Eigen::Map< Eigen::VectorXd > constraintsEvaluation = toEigen(constraintsValue);
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                if (!(group.second->group_ptr->evaluateConstraints(time, state, control, group.second->constraintsBuffer))){
                    std::ostringstream errorMsg;
                    errorMsg << "Error while evaluating constraint " << group.second->group_ptr->name() <<".";
                    reportError("OptimalControlProblem", "constraintsEvaluation", errorMsg.str().c_str());
                    return false;
                }

                constraintsEvaluation.segment(offset, group.second->constraintsBuffer.size()) = toEigen(group.second->constraintsBuffer);
                offset += group.second->constraintsBuffer.size();
            }

            return true;
        }